

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SStream.c
# Opt level: O0

void printInt64(SStream *O,int64_t val)

{
  long in_RSI;
  SStream *in_RDI;
  
  if (in_RSI < 0) {
    if (in_RSI < -9) {
      if (in_RSI == -0x8000000000000000) {
        SStream_concat(in_RDI,"-0x%lx",0x8000000000000000);
      }
      else {
        SStream_concat(in_RDI,"-0x%lx",-in_RSI);
      }
    }
    else {
      SStream_concat(in_RDI,"-%lu",-in_RSI);
    }
  }
  else if (in_RSI < 10) {
    SStream_concat(in_RDI,"%lu",in_RSI);
  }
  else {
    SStream_concat(in_RDI,"0x%lx",in_RSI);
  }
  return;
}

Assistant:

void printInt64(SStream *O, int64_t val)
{
	if (val >= 0) {
		if (val > HEX_THRESHOLD)
			SStream_concat(O, "0x%"PRIx64, val);
		else
			SStream_concat(O, "%"PRIu64, val);
	} else {
		if (val <- HEX_THRESHOLD) {
			if (val == LONG_MIN)
				SStream_concat(O, "-0x%"PRIx64, (uint64_t)val);
			else
				SStream_concat(O, "-0x%"PRIx64, (uint64_t)-val);
		}
		else
			SStream_concat(O, "-%"PRIu64, -val);
	}
}